

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPlistParser.cxx
# Opt level: O2

optional<Json::Value> * cmParsePlist(optional<Json::Value> *__return_storage_ptr__,string *filename)

{
  bool bVar1;
  int fd;
  Status *pSVar2;
  uv_loop_t *loop;
  long lVar3;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  cmUVProcessChain chain;
  allocator_type local_35c;
  allocator<char> local_35b;
  allocator<char> local_35a;
  allocator<char> local_359;
  Value value;
  cmUVProcessChainBuilder builder;
  cmUVPipeIStream outputStream;
  Reader reader;
  
  cmUVProcessChainBuilder::cmUVProcessChainBuilder(&builder);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&outputStream,"/usr/bin/plutil",(allocator<char> *)&value);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &outputStream.super_cmBasicUVIStream<char,_std::char_traits<char>_>.
              super_basic_istream<char,_std::char_traits<char>_>.field_0x20,"-convert",
             (allocator<char> *)&chain);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &outputStream.super_cmBasicUVIStream<char,_std::char_traits<char>_>.
              super_basic_istream<char,_std::char_traits<char>_>.field_0x40,"json",&local_359);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &outputStream.super_cmBasicUVIStream<char,_std::char_traits<char>_>.
              super_basic_istream<char,_std::char_traits<char>_>.field_0x60,"-o",&local_35a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &outputStream.super_cmBasicUVIStream<char,_std::char_traits<char>_>.
              super_basic_istream<char,_std::char_traits<char>_>.field_0x80,"-",&local_35b);
  std::__cxx11::string::string
            ((string *)
             &outputStream.super_cmBasicUVIStream<char,_std::char_traits<char>_>.
              super_basic_istream<char,_std::char_traits<char>_>.field_0xa0,(string *)filename);
  __l._M_len = 6;
  __l._M_array = (iterator)&outputStream;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&reader,__l,&local_35c);
  cmUVProcessChainBuilder::AddCommand
            (&builder,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&reader);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&reader);
  lVar3 = 0xa0;
  do {
    std::__cxx11::string::~string
              ((string *)
               ((long)&outputStream.super_cmBasicUVIStream<char,_std::char_traits<char>_>.
                       super_basic_istream<char,_std::char_traits<char>_>._vptr_basic_istream +
               lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  cmUVProcessChainBuilder::SetBuiltinStream(&builder,Stream_OUTPUT);
  cmUVProcessChainBuilder::Start((cmUVProcessChainBuilder *)&chain);
  cmUVProcessChain::Wait(&chain,0);
  pSVar2 = cmUVProcessChain::GetStatus(&chain,0);
  if (pSVar2->ExitStatus == 0) {
    Json::Reader::Reader(&reader);
    Json::Value::Value(&value,nullValue);
    loop = cmUVProcessChain::GetLoop(&chain);
    fd = cmUVProcessChain::OutputStream(&chain);
    cmBasicUVPipeIStream<char,_std::char_traits<char>_>::cmBasicUVPipeIStream(&outputStream,loop,fd)
    ;
    bVar1 = Json::Reader::parse(&reader,(istream *)&outputStream,&value,true);
    if (bVar1) {
      std::_Optional_payload_base<Json::Value>::_Optional_payload_base<Json::Value&>
                ((_Optional_payload_base<Json::Value> *)__return_storage_ptr__,&value);
    }
    else {
      (__return_storage_ptr__->super__Optional_base<Json::Value,_false,_false>)._M_payload.
      super__Optional_payload<Json::Value,_true,_false,_false>.
      super__Optional_payload_base<Json::Value>._M_engaged = false;
    }
    cmBasicUVPipeIStream<char,_std::char_traits<char>_>::~cmBasicUVPipeIStream(&outputStream);
    Json::Value::~Value(&value);
    Json::Reader::~Reader(&reader);
  }
  else {
    (__return_storage_ptr__->super__Optional_base<Json::Value,_false,_false>)._M_payload.
    super__Optional_payload<Json::Value,_true,_false,_false>.
    super__Optional_payload_base<Json::Value>._M_engaged = false;
  }
  cmUVProcessChain::~cmUVProcessChain(&chain);
  cmUVProcessChainBuilder::~cmUVProcessChainBuilder(&builder);
  return __return_storage_ptr__;
}

Assistant:

cm::optional<Json::Value> cmParsePlist(const std::string& filename)
{
  cmUVProcessChainBuilder builder;
  builder.AddCommand(
    { "/usr/bin/plutil", "-convert", "json", "-o", "-", filename });
  builder.SetBuiltinStream(cmUVProcessChainBuilder::Stream_OUTPUT);

  auto chain = builder.Start();
  chain.Wait();

  auto const& status = chain.GetStatus(0);
  if (status.ExitStatus != 0) {
    return cm::nullopt;
  }

  Json::Reader reader;
  Json::Value value;
  cmUVPipeIStream outputStream(chain.GetLoop(), chain.OutputStream());
  if (!reader.parse(outputStream, value)) {
    return cm::nullopt;
  }
  return cm::optional<Json::Value>(value);
}